

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

void __thiscall QIODevicePrivate::~QIODevicePrivate(QIODevicePrivate *this)

{
  undefined8 *in_RDI;
  QVarLengthArray<QRingBuffer,_2LL> *unaff_retaddr;
  
  *in_RDI = &PTR__QIODevicePrivate_002006b0;
  QString::~QString((QString *)0x128e81);
  QVarLengthArray<QRingBuffer,_1LL>::~QVarLengthArray
            ((QVarLengthArray<QRingBuffer,_1LL> *)unaff_retaddr);
  QVarLengthArray<QRingBuffer,_2LL>::~QVarLengthArray(unaff_retaddr);
  return;
}

Assistant:

QIODevicePrivate::~QIODevicePrivate()
{
}